

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfloat16.cpp
# Opt level: O2

QTextStream * operator>>(QTextStream *ts,qfloat16 *f16)

{
  long in_FS_OFFSET;
  float f;
  anon_union_2_1_ba1d3167_for_qfloat16_1 local_26;
  float local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_24 = -NAN;
  QTextStream::operator>>(ts,&local_24);
  qfloat16::qfloat16((qfloat16 *)&local_26,local_24);
  f16->field_0 = local_26;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return ts;
  }
  __stack_chk_fail();
}

Assistant:

QTextStream &operator>>(QTextStream &ts, qfloat16 &f16)
{
    float f;
    ts >> f;
    f16 = qfloat16(f);
    return ts;
}